

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,ScopedMessage *old)

{
  MessageInfo *in_RSI;
  MessageInfo *in_RDI;
  
  MessageInfo::MessageInfo(in_RSI,in_RDI);
  *(undefined1 *)&in_RDI[1].macroName.m_start = 0;
  *(undefined1 *)&in_RSI[1].macroName.m_start = 1;
  return;
}

Assistant:

ScopedMessage::ScopedMessage( ScopedMessage&& old )
    : m_info( old.m_info ), m_moved()
    {
        old.m_moved = true;
    }